

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

int tcg_gen_code_riscv64(TCGContext_conflict11 *s,TranslationBlock *tb)

{
  anon_union_16_2_aaf24f3d_for_link *paVar1;
  TCGTemp **ppTVar2;
  tcg_insn_unit **pptVar3;
  char **ppcVar4;
  ushort uVar5;
  TCGOp *pTVar6;
  TCGArg TVar7;
  tcg_insn_unit *ptVar8;
  tcg_target_ulong tVar9;
  TCGArgConstraint *pTVar10;
  TCGOpDef *pTVar11;
  ulong uVar12;
  uintptr_t value;
  TCGRegSet *pTVar13;
  uint *puVar14;
  anon_union_16_2_aaf24f3d_for_link *paVar15;
  TCGContext_conflict11 *pTVar16;
  tcg_insn_unit tVar17;
  byte bVar18;
  _Bool _Var19;
  TCGOpcode TVar20;
  TCGReg TVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  char *pcVar25;
  ulong uVar26;
  TCGOp *pTVar27;
  TCGOp *pTVar28;
  TCGTemp *pTVar29;
  ulong uVar30;
  TCGCond *pTVar31;
  byte *pbVar32;
  uint8_t *puVar33;
  QTailQLink *pQVar34;
  QTailQLink *extraout_RAX;
  void **ppvVar35;
  undefined8 extraout_RAX_00;
  TCGLifeData arg_life;
  uint uVar36;
  TCGRegSet TVar37;
  uint uVar38;
  TCGCond base;
  long lVar39;
  TCGOp *pTVar40;
  TCGContext_conflict11 *pTVar41;
  undefined1 *puVar42;
  QTailQLink *pQVar43;
  QTailQLink *pQVar44;
  TCGCond r;
  TCGArg TVar45;
  TCGRegSet TVar46;
  TCGRegSet allocated_regs;
  int iVar47;
  TCGCond TVar48;
  TCGContext_conflict11 *pTVar49;
  ulong uVar50;
  byte bVar52;
  undefined2 uVar53;
  uint uVar54;
  TCGContext_conflict11 *pTVar55;
  TCGOpcode TVar56;
  TCGType TVar57;
  uint uVar58;
  TCGTemp *pTVar59;
  ulong uVar60;
  TCGTemp *pTVar61;
  TCGContext_conflict11 *pTVar62;
  TCGRegSet preferred_regs;
  uint uVar63;
  TCGContext_conflict11 *in_R9;
  TCGContext_conflict11 *pTVar64;
  byte bVar65;
  uint uVar66;
  int iVar67;
  ulong unaff_R12;
  long lVar68;
  TCGLabelQemuLdst *pTVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  tcg_insn_unit **pptVar74;
  TCGLabel *pTVar75;
  TCGRelocation *pTVar76;
  bool bVar77;
  TCGArg new_args [16];
  TCGContext_conflict11 *in_stack_fffffffffffffe68;
  TCGContext_conflict11 *local_108;
  TCGContext_conflict11 *local_100;
  TCGContext_conflict11 *local_f8;
  tcg_insn_unit local_f0;
  undefined4 uStack_ec;
  int local_e8;
  undefined4 uStack_e4;
  TCGCond local_e0;
  undefined4 uStack_dc;
  void **local_88;
  void **local_80;
  int local_78;
  int local_74;
  uint local_70;
  int local_68;
  int local_64;
  TCGContext_conflict11 *pTVar51;
  
  pcVar25 = getenv("UNICORN_DEBUG");
  if (pcVar25 != (char *)0x0) {
    tcg_dump_ops_riscv64(s,false,"TCG before optimization:");
  }
  tcg_optimize_riscv64(s);
  if ((s->ops).tqh_first != (TCGOp *)0x0) {
    uVar26 = 0;
    pTVar40 = (s->ops).tqh_first;
    do {
      pTVar6 = (pTVar40->link).tqe_next;
      uVar66 = *(uint *)pTVar40;
      uVar36 = uVar66 & 0xff;
      uVar30 = uVar26;
      if (uVar36 < 0x81) {
        if (uVar36 == 1) {
          uVar66 = *(uint *)pTVar40->args[0];
          unaff_R12 = CONCAT71((int7)(unaff_R12 >> 8),1);
          if (0xffff < uVar66) {
            if ((((uVar66 & 0xffff0000) == 0x10000) &&
                (pTVar27 = (TCGOp *)((pTVar40->link).tqe_circ.tql_prev)->tql_prev->tql_next,
                *(char *)pTVar27 == '\x03')) &&
               ((uint *)pTVar40->args[0] == (uint *)pTVar27->args[0])) {
              tcg_op_remove_riscv64(s,pTVar27);
            }
            else {
              unaff_R12 = 0;
            }
            uVar30 = 0;
          }
        }
        else if (uVar36 == 2) {
          unaff_R12 = uVar26;
          if ((pTVar40->args[(ulong)((uVar66 >> 8 & 0xf) + (uVar66 >> 0xc & 0xf)) + 1] & 8) != 0) {
            uVar30 = 1;
          }
        }
        else {
          unaff_R12 = uVar26;
          if (uVar36 == 3) goto LAB_00c5a239;
        }
      }
      else if (uVar36 == 0x81) {
        unaff_R12 = 0;
      }
      else if ((uVar36 == 0x82) || (unaff_R12 = uVar26, uVar36 == 0x84)) {
LAB_00c5a239:
        uVar30 = 1;
        unaff_R12 = uVar26;
      }
      if ((unaff_R12 & 1) != 0) {
        tcg_op_remove_riscv64(s,pTVar40);
      }
      uVar26 = uVar30;
      pTVar40 = pTVar6;
    } while (pTVar6 != (TCGOp *)0x0);
  }
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    iVar23 = s->nb_globals;
    if ((long)iVar23 < 1) {
      uVar26 = 0;
    }
    else {
      pTVar29 = s->temps;
      uVar26 = 0;
      pTVar59 = pTVar29;
      do {
        if ((pTVar59->field_0x4 & 2) == 0) {
          pTVar61 = (TCGTemp *)0x0;
        }
        else {
          iVar67 = s->nb_temps;
          s->nb_temps = iVar67 + 1;
          pTVar61 = pTVar29 + iVar67;
          ppcVar4 = &s->temps[iVar67].name;
          *ppcVar4 = (char *)0x0;
          ppcVar4[1] = (char *)0x0;
          ppTVar2 = &s->temps[iVar67].mem_base;
          *ppTVar2 = (TCGTemp *)0x0;
          ppTVar2[1] = (TCGTemp *)0x0;
          *(undefined8 *)(pTVar29 + iVar67) = 0;
          pTVar29[iVar67].val = 0;
          s->temps[iVar67].state_ptr = (void *)0x0;
          in_R9 = (TCGContext_conflict11 *)((ulong)(byte)pTVar59->field_0x3 << 0x18);
          *(TCGContext_conflict11 **)(pTVar29 + iVar67) = in_R9;
          *(ulong *)(pTVar29 + iVar67) =
               (ulong)((uint)(byte)pTVar59->field_0x2 << 0x10 | (uint)in_R9);
        }
        pTVar59->state_ptr = pTVar61;
        pTVar59->state = 1;
        uVar26 = uVar26 + 1;
        pTVar59 = pTVar59 + 1;
      } while ((long)iVar23 != uVar26);
    }
    if ((int)uVar26 < s->nb_temps) {
      lVar39 = (ulong)(uint)s->nb_temps - (uVar26 & 0xffffffff);
      ppvVar35 = &s->temps[uVar26 & 0xffffffff].state_ptr;
      do {
        *ppvVar35 = (void *)0x0;
        ppvVar35[-1] = (void *)0x1;
        ppvVar35 = ppvVar35 + 7;
        lVar39 = lVar39 + -1;
      } while (lVar39 != 0);
    }
    if ((s->ops).tqh_first != (TCGOp *)0x0) {
      bVar77 = false;
      pTVar40 = (s->ops).tqh_first;
      do {
        uVar66 = *(uint *)pTVar40;
        if ((uVar66 & 0xff) == 2) {
          pTVar62 = (TCGContext_conflict11 *)(ulong)(uVar66 >> 0xc & 0xf);
          uVar54 = uVar66 >> 8 & 0xf;
        }
        else {
          uVar36 = (uVar66 & 0xff) << 5;
          uVar54 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar36];
          pTVar62 = (TCGContext_conflict11 *)(ulong)(&s->tcg_op_defs->nb_oargs)[uVar36];
        }
        pTVar6 = (pTVar40->link).tqe_next;
        uVar66 = uVar66 >> 0x10;
        unaff_R12 = (ulong)uVar66;
        if (uVar54 != 0) {
          pTVar55 = (TCGContext_conflict11 *)(ulong)(uVar54 + (int)pTVar62);
          pTVar49 = pTVar62;
          do {
            TVar45 = pTVar40->args[(long)pTVar49];
            if (((TVar45 != 0) && (TVar7 = *(TCGArg *)(TVar45 + 0x30), TVar7 != 0)) &&
               (*(long *)(TVar45 + 0x28) == 1)) {
              TVar56 = INDEX_op_ld_i32;
              if (*(char *)(TVar45 + 3) != '\0') {
                TVar56 = INDEX_op_ld_i64;
              }
              pTVar27 = tcg_op_alloc(s,TVar56);
              (pTVar27->link).tqe_circ.tql_prev = (pTVar40->link).tqe_circ.tql_prev;
              (pTVar27->link).tqe_next = pTVar40;
              ((pTVar40->link).tqe_circ.tql_prev)->tql_next = pTVar27;
              (pTVar40->link).tqe_circ.tql_prev = (QTailQLink *)&pTVar27->link;
              pTVar27->args[0] = TVar7;
              pTVar27->args[1] = *(TCGArg *)(TVar45 + 0x10);
              pTVar27->args[2] = *(TCGArg *)(TVar45 + 0x18);
              *(undefined8 *)(TVar45 + 0x28) = 2;
            }
            pTVar49 = (TCGContext_conflict11 *)((long)&pTVar49->pool_cur + 1);
            pTVar41 = pTVar62;
          } while (pTVar49 < pTVar55);
          do {
            TVar45 = pTVar40->args[(long)pTVar41];
            if ((TVar45 != 0) && (*(TCGArg *)(TVar45 + 0x30) != 0)) {
              pTVar40->args[(long)pTVar41] = *(TCGArg *)(TVar45 + 0x30);
              bVar77 = true;
              if ((uVar66 >> ((byte)pTVar41 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar45 + 0x28) = 1;
              }
            }
            pTVar41 = (TCGContext_conflict11 *)((long)&pTVar41->pool_cur + 1);
          } while (pTVar41 < pTVar55);
        }
        in_R9 = pTVar62;
        if ((int)pTVar62 != 0) {
          paVar1 = &pTVar40->link;
          pTVar49 = (TCGContext_conflict11 *)0x0;
          do {
            TVar45 = pTVar40->args[(long)pTVar49];
            TVar7 = *(TCGArg *)(TVar45 + 0x30);
            if (TVar7 != 0) {
              pTVar40->args[(long)pTVar49] = TVar7;
              *(undefined8 *)(TVar45 + 0x28) = 0;
              if ((uVar66 >> ((uint)pTVar49 & 0x1f) & 1) != 0) {
                TVar56 = INDEX_op_st_i32;
                if (*(char *)(TVar45 + 3) != '\0') {
                  TVar56 = INDEX_op_st_i64;
                }
                pTVar28 = tcg_op_alloc(s,TVar56);
                pTVar27 = paVar1->tqe_next;
                (pTVar28->link).tqe_next = pTVar27;
                paVar15 = &pTVar27->link;
                if (pTVar27 == (TCGOp *)0x0) {
                  paVar15 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
                }
                (paVar15->tqe_circ).tql_prev = (QTailQLink *)&pTVar28->link;
                paVar1->tqe_next = pTVar28;
                (pTVar28->link).tqe_circ.tql_prev = (QTailQLink *)paVar1;
                pTVar28->args[0] = TVar7;
                pTVar28->args[1] = *(TCGArg *)(TVar45 + 0x10);
                pTVar28->args[2] = *(TCGArg *)(TVar45 + 0x18);
                *(undefined8 *)(TVar45 + 0x28) = 2;
              }
              bVar77 = true;
              if ((uVar66 >> ((byte)pTVar49 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar45 + 0x28) = 1;
              }
            }
            pTVar49 = (TCGContext_conflict11 *)((long)&pTVar49->pool_cur + 1);
          } while (pTVar62 != pTVar49);
        }
        pTVar40 = pTVar6;
      } while (pTVar6 != (TCGOp *)0x0);
      if (bVar77) {
        liveness_pass_1(s);
      }
    }
  }
  iVar23 = s->nb_globals;
  if ((long)iVar23 < 1) {
    uVar26 = 0;
  }
  else {
    pTVar29 = s->temps;
    uVar26 = 0;
    do {
      pTVar29->field_0x1 =
           (char)((uint)(((undefined1  [56])*pTVar29 & (undefined1  [56])0x100000000) ==
                        (undefined1  [56])0x0) * 0x100 + 0x100 >> 8);
      uVar26 = uVar26 + 1;
      pTVar29 = pTVar29 + 1;
    } while ((long)iVar23 != uVar26);
  }
  if ((int)uVar26 < s->nb_temps) {
    lVar39 = (ulong)(uint)s->nb_temps - (uVar26 & 0xffffffff);
    pTVar29 = s->temps + (uVar26 & 0xffffffff);
    do {
      *(ulong *)pTVar29 =
           *(ulong *)pTVar29 & 0xffffffeeffff00ff |
           (ulong)((uint)(*(ulong *)pTVar29 >> 0x1d) & 0x200);
      pTVar29 = pTVar29 + 1;
      lVar39 = lVar39 + -1;
    } while (lVar39 != 0);
  }
  ppTVar2 = s->reg_to_temp;
  memset(ppTVar2,0,0x100);
  ptVar8 = (tcg_insn_unit *)(tb->tc).ptr;
  s->code_buf = ptVar8;
  s->code_ptr = ptVar8;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &(s->ldst_labels).sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar25 = getenv("UNICORN_DEBUG");
  if (pcVar25 != (char *)0x0) {
    tcg_dump_ops_riscv64(s,false,"TCG before codegen:");
  }
  pptVar3 = &s->code_ptr;
  pTVar40 = (s->ops).tqh_first;
  if (pTVar40 == (TCGOp *)0x0) {
    uVar26 = 0xffffffff;
  }
  else {
    local_80 = &s->tb_ret_addr;
    local_88 = &s->code_gen_epilogue;
    uVar26 = 0xffffffff;
    do {
      TVar56 = *(TCGOpcode *)pTVar40;
      TVar20 = TVar56 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
      iVar23 = (int)uVar26;
      arg_life = (TCGLifeData)(TVar56 >> 0x10);
      if (INDEX_op_ctpop_i32 < TVar20) {
        if (TVar20 < INDEX_op_mov_vec) {
          if (TVar20 != INDEX_op_mov_i64) {
            if (TVar20 != INDEX_op_insn_start) {
              if (TVar20 == INDEX_op_movi_i64) goto switchD_00c5a794_caseD_6;
              goto switchD_00c5a794_caseD_3;
            }
            if ((iVar23 < 0) ||
               (uVar30 = (long)s->code_ptr - (long)s->code_buf,
               s->gen_insn_end_off[uVar26] = (uint16_t)uVar30, uVar30 < 0x10000)) {
              uVar26 = (ulong)(iVar23 + 1);
              s->gen_insn_data[(long)iVar23 + 1][0] = pTVar40->args[0];
              goto LAB_00c5accd;
            }
            goto LAB_00c5c933;
          }
        }
        else if (TVar20 != INDEX_op_mov_vec) {
          if (TVar20 != INDEX_op_dup_vec) {
            if (TVar20 == INDEX_op_dupi_vec) goto switchD_00c5a794_caseD_6;
            goto switchD_00c5a794_caseD_3;
          }
          pTVar29 = (TCGTemp *)pTVar40->args[0];
          pTVar59 = (TCGTemp *)pTVar40->args[1];
          uVar66 = *(uint *)pTVar59;
          uVar36 = uVar66 >> 8 & 0xff;
          if (uVar36 == 3) {
            tVar9 = pTVar59->val;
            if ((TVar56 >> 0x13 & 1) != 0) {
              temp_free_or_dead(s,pTVar59,1);
            }
            tcg_reg_alloc_do_movi(s,pTVar29,tVar9,arg_life,pTVar40->output_pref[0]);
            goto LAB_00c5acc8;
          }
          pTVar10 = s->tcg_op_defs[0x8b].args_ct;
          uVar54 = pTVar10[1].u.regs;
          if (((uint)*(ulong *)pTVar29 & 0xff00) != 0x100) {
            uVar24 = 1 << ((byte)uVar66 & 0x1f);
            if (uVar36 != 1 || (TVar56 & 0x80000) != INDEX_op_discard) {
              uVar24 = 0;
            }
            TVar21 = tcg_reg_alloc(s,(pTVar10->u).regs,uVar24 | s->reserved_regs,
                                   pTVar40->output_pref[0],(*(ulong *)pTVar29 & 0x400000000) != 0);
            *(ulong *)pTVar29 =
                 (*(ulong *)pTVar29 & 0xfffffff7ffff0000) + (ulong)(TVar21 & 0xff) + 0x100;
            s->reg_to_temp[TVar21 & 0xff] = pTVar29;
          }
          uVar36 = TVar56 >> 0xc & 0xf;
          TVar57 = (TVar56 >> 8 & 0xf) + TCG_TYPE_V64;
          uVar30 = *(ulong *)pTVar59;
          if ((char)(uVar30 >> 8) == '\x02') {
LAB_00c5b4dd:
            in_R9 = (TCGContext_conflict11 *)pTVar59->mem_offset;
            tcg_out_dupm_vec(s,TVar57,uVar36,(uint)*(byte *)pTVar29,(uint)*(byte *)pTVar59->mem_base
                             ,(intptr_t)in_R9);
          }
          else {
            if (((uint)(uVar30 >> 8) & 0xff) != 1) {
              pcVar25 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
              ;
              iVar23 = 0xd22;
              goto LAB_00c5c95e;
            }
            TVar21 = (TCGReg)uVar30 & 0xff;
            if ((uVar54 >> ((TCGReg)uVar30 & TCG_REG_XMM15) & 1) == 0) {
              if ((uVar30 >> 0x23 & 1) != 0) goto LAB_00c5b4dd;
              tcg_out_mov(s,uVar66 >> 0x18,(uint)*(byte *)pTVar29,TVar21);
              bVar18 = *(byte *)pTVar29;
              TVar21 = (TCGReg)bVar18;
            }
            else {
              bVar18 = *(byte *)pTVar29;
            }
            tcg_out_dup_vec(s,TVar57,uVar36,(uint)bVar18,TVar21);
          }
          if ((TVar56 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar59,1);
          }
          if ((TVar56 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar29,s->reserved_regs,0,0);
          }
          if ((TVar56 >> 0x12 & 1) != 0) {
            temp_free_or_dead(s,pTVar29,1);
          }
          goto LAB_00c5acc8;
        }
switchD_00c5a794_caseD_5:
        uVar66 = s->reserved_regs;
        TVar37 = pTVar40->output_pref[0];
        pTVar29 = (TCGTemp *)pTVar40->args[0];
        pTVar59 = (TCGTemp *)pTVar40->args[1];
        TVar57 = (TCGType)(byte)pTVar29->field_0x3;
        uVar30 = *(ulong *)pTVar59;
        if ((char)(uVar30 >> 8) == '\x02') {
          temp_load(s,pTVar59,s->tcg_target_available_regs[uVar30 >> 0x18 & 0xff],uVar66,TVar37);
        }
        else if (((uint)(uVar30 >> 8) & 0xff) == 3) {
          tVar9 = pTVar59->val;
          if ((TVar56 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar59,1);
          }
          tcg_reg_alloc_do_movi(s,pTVar29,tVar9,arg_life,TVar37);
          goto LAB_00c5acc8;
        }
        if ((TVar56 >> 0x12 & 1) == 0) {
          uVar30 = *(ulong *)pTVar29;
          uVar36 = (uint)uVar30 & 0xff00;
          if (((TVar56 >> 0x13 & 1) == 0) || ((*(ulong *)pTVar59 & 0x100000000) != 0)) {
            if (uVar36 != 0x100) {
              uVar66 = uVar66 | 1 << ((uint)*(ulong *)pTVar59 & 0x1f);
              TVar21 = tcg_reg_alloc(s,s->tcg_target_available_regs[TVar57],uVar66,TVar37,
                                     (uVar30 & 0x400000000) != 0);
              *(char *)pTVar29 = (char)TVar21;
            }
            tcg_out_mov(s,TVar57,(uint)*(byte *)pTVar29,(uint)*(byte *)pTVar59);
          }
          else {
            if (uVar36 == 0x100) {
              ppTVar2[uVar30 & 0xff] = (TCGTemp *)0x0;
            }
            *(undefined1 *)pTVar29 = *(undefined1 *)pTVar59;
            temp_free_or_dead(s,pTVar59,1);
          }
          uVar30 = *(ulong *)pTVar29;
          *(ulong *)pTVar29 = uVar30 & 0xfffffff7ffff00ff | 0x100;
          ppTVar2[uVar30 & 0xff] = pTVar29;
          if ((TVar56 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar29,uVar66,0,0);
          }
        }
        else {
          if ((pTVar29->field_0x4 & 0x10) == 0) {
            temp_allocate_frame(s,pTVar29);
          }
          tcg_out_st(s,TVar57,(uint)*(byte *)pTVar59,(uint)*(byte *)pTVar29->mem_base,
                     pTVar29->mem_offset);
          if ((TVar56 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar59,1);
          }
          temp_free_or_dead(s,pTVar29,1);
        }
LAB_00c5acc8:
        unaff_R12 = unaff_R12 & 0xffffffff;
        goto LAB_00c5accd;
      }
      switch(TVar20) {
      case INDEX_op_discard:
        temp_free_or_dead(s,(TCGTemp *)pTVar40->args[0],1);
        goto LAB_00c5accd;
      case INDEX_op_set_label:
        tcg_gen_code_riscv64_cold_19();
        goto LAB_00c5accd;
      case INDEX_op_call:
        uVar36 = TVar56 >> 8 & 0xf;
        uVar66 = 6;
        if (uVar36 < 6) {
          uVar66 = TVar56 >> 8 & 0xf;
        }
        if (((long)(int)(uVar36 - uVar66) * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
          uVar54 = TVar56 >> 0xc & 0xf;
          uVar30 = (ulong)uVar54;
          ptVar8 = (tcg_insn_unit *)pTVar40->args[uVar54 + uVar36];
          if (6 < uVar36) {
            lVar39 = 0;
            do {
              pTVar29 = *(TCGTemp **)((long)pTVar40->args + lVar39 + uVar30 * 8 + 0x30);
              if (pTVar29 != (TCGTemp *)0x0) {
                temp_load(s,pTVar29,s->tcg_target_available_regs[(byte)pTVar29->field_0x3],
                          s->reserved_regs,0);
                tcg_out_st(s,*(TCGReg *)pTVar29 >> 0x18,*(TCGReg *)pTVar29 & 0xff,TCG_REG_CALL_STACK
                           ,lVar39);
              }
              lVar39 = lVar39 + 8;
            } while ((ulong)uVar36 * 8 + -0x30 != lVar39);
          }
          uVar24 = s->reserved_regs;
          if (uVar36 != 0) {
            uVar50 = 0;
            do {
              pTVar29 = *(TCGTemp **)((long)pTVar40->args + uVar50 * 2 + uVar30 * 8);
              if (pTVar29 != (TCGTemp *)0x0) {
                TVar21 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar50);
                if (((TCGReg)*(undefined8 *)pTVar29 & 0xff00) == 0x100) {
                  if (((TCGReg)*(undefined8 *)pTVar29 & 0xff) != TVar21) {
                    if (ppTVar2[TVar21] != (TCGTemp *)0x0) {
                      temp_sync(s,ppTVar2[TVar21],uVar24,0,-1);
                    }
                    tcg_out_mov(s,*(TCGReg *)pTVar29 >> 0x18,TVar21,*(TCGReg *)pTVar29 & 0xff);
                  }
                }
                else {
                  if (ppTVar2[TVar21] != (TCGTemp *)0x0) {
                    temp_sync(s,ppTVar2[TVar21],uVar24,0,-1);
                  }
                  temp_load(s,pTVar29,1 << ((byte)TVar21 & 0x1f),uVar24,0);
                }
                uVar24 = uVar24 | 1 << (TVar21 & TCG_REG_XMM15);
              }
              uVar50 = uVar50 + 4;
            } while (uVar66 << 2 != uVar50);
          }
          uVar66 = TVar56 >> 0x10;
          uVar50 = uVar30;
          if (uVar36 != 0) {
            do {
              if ((uVar66 >> ((byte)uVar50 & 0x1f) & 4) != 0) {
                temp_free_or_dead(s,(TCGTemp *)pTVar40->args[uVar50],1);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 < uVar54 + uVar36);
          }
          lVar39 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar39] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar39],uVar24,0,-1);
            }
            lVar39 = lVar39 + 1;
          } while (lVar39 != 0x20);
          tcg_out_branch(s,1,ptVar8);
          if (uVar54 != 0) {
            uVar50 = 0;
            do {
              pTVar29 = (TCGTemp *)pTVar40->args[uVar50];
              if (((uint)*(ulong *)pTVar29 & 0xff00) == 0x100) {
                ppTVar2[*(ulong *)pTVar29 & 0xff] = (TCGTemp *)0x0;
              }
              *(ulong *)pTVar29 = *(ulong *)pTVar29 & 0xfffffff7ffff0000 | 0x100;
              *ppTVar2 = pTVar29;
              uVar36 = 4 << ((byte)uVar50 & 0x1f) & uVar66;
              if ((uVar66 >> ((uint)uVar50 & 0x1f) & 1) == 0) {
                if (uVar36 != 0) {
                  temp_free_or_dead(s,pTVar29,1);
                }
              }
              else {
                temp_sync(s,pTVar29,uVar24,0,uVar36);
              }
              uVar50 = uVar50 + 1;
            } while (uVar30 != uVar50);
          }
          goto LAB_00c5acc8;
        }
        tcg_gen_code_riscv64_cold_1();
        goto switchD_00c5c6b7_caseD_7;
      case INDEX_op_mov_i32:
        goto switchD_00c5a794_caseD_5;
      case INDEX_op_movi_i32:
switchD_00c5a794_caseD_6:
        tcg_gen_code_riscv64_cold_20();
        goto LAB_00c5accd;
      }
switchD_00c5a794_caseD_3:
      tcg_op_supported_riscv64(TVar56 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
      uVar66 = TVar56 >> 0x10;
      pTVar11 = s->tcg_op_defs;
      uVar71 = (ulong)((TVar56 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
      uVar30 = (ulong)(&pTVar11->nb_oargs)[uVar71];
      bVar18 = (&pTVar11->nb_iargs)[uVar71];
      uVar50 = (ulong)bVar18;
      lVar39 = (ulong)(&pTVar11->nb_oargs)[uVar71] * 8;
      pTVar62 = (TCGContext_conflict11 *)
                ((long)&stack0xfffffffffffffef8 + (ulong)((uint)bVar18 * 8) + lVar39);
      memcpy(pTVar62,(void *)((long)pTVar40->args + (ulong)((uint)bVar18 * 8) + lVar39),
             (ulong)(&pTVar11->nb_cargs)[uVar71] << 3);
      TVar37 = s->reserved_regs;
      allocated_regs = TVar37;
      if (bVar18 != 0) {
        uVar72 = 0;
        do {
          lVar39 = *(long *)((long)&pTVar11->args_ct + uVar71);
          lVar73 = *(long *)((long)&pTVar11->sorted_args + uVar71);
          iVar23 = *(int *)(lVar73 + uVar72 * 4 + uVar30 * 4);
          lVar68 = (long)iVar23;
          pTVar29 = (TCGTemp *)pTVar40->args[lVar68];
          uVar12 = *(ulong *)pTVar29;
          uVar36 = (uint)uVar12 & 0xff00;
          in_R9 = s;
          if (uVar36 == 0x300) {
            uVar60 = pTVar29->val;
            uVar5 = *(ushort *)(lVar39 + lVar68 * 8);
            pTVar62 = (TCGContext_conflict11 *)(ulong)uVar5;
            if (((((uVar5 & 2) == 0) && (((long)(int)uVar60 != uVar60 || ((uVar5 & 0x100) == 0))))
                && ((uVar60 >> 0x20 != 0 || ((uVar5 & 0x200) == 0)))) &&
               (((uVar60 + 0x80000000 >> 0x20 != 0 || ((uVar5 & 0x400) == 0)) &&
                (((uVar5 >> 0xb & 1) == 0 ||
                 (pTVar62 = (TCGContext_conflict11 *)(uVar12 >> 0x18),
                 (ulong)((char)(uVar12 >> 0x18) != '\0') * 0x20 + 0x20 != uVar60))))))
            goto LAB_00c5afba;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar68 * 4) = 1;
            *(ulong *)((long)&stack0xfffffffffffffef8 + lVar68 * 8) = uVar60;
          }
          else {
LAB_00c5afba:
            if ((*(byte *)(lVar39 + lVar68 * 8) & 0x40) == 0) {
              TVar46 = 0;
              preferred_regs = 0;
LAB_00c5afc7:
              pTVar62 = s;
              temp_load(s,pTVar29,*(TCGRegSet *)(lVar39 + 4 + lVar68 * 8),allocated_regs,
                        preferred_regs);
              if ((*(uint *)(lVar39 + 4 + lVar68 * 8) >> (*(TCGReg *)pTVar29 & TCG_REG_XMM15) & 1)
                  == 0) goto LAB_00c5b086;
              TVar21 = *(TCGReg *)pTVar29 & 0xff;
            }
            else {
              bVar18 = *(byte *)(lVar39 + 2 + lVar68 * 8);
              TVar46 = pTVar40->output_pref[bVar18];
              if ((uVar12 & 0x100000000) == 0) {
                uVar54 = uVar66 >> ((byte)iVar23 & 0x1f);
                pTVar62 = (TCGContext_conflict11 *)(ulong)uVar54;
                if ((uVar54 & 4) != 0) {
                  preferred_regs = TVar46;
                  if (uVar36 == 0x100) {
                    iVar23 = 0;
                    if (uVar72 != 0) {
                      uVar60 = 0;
                      do {
                        pTVar62 = (TCGContext_conflict11 *)
                                  (long)*(int *)(lVar73 + uVar30 * 4 + uVar60 * 4);
                        if (((*(byte *)(lVar39 + (long)pTVar62 * 8) & 0x40) != 0) &&
                           ((uVar12 & 0xff) ==
                            *(ulong *)((long)&stack0xfffffffffffffef8 + (long)pTVar62 * 8))) {
                          iVar23 = 5;
                          break;
                        }
                        uVar60 = uVar60 + 1;
                      } while (uVar72 != uVar60);
                    }
                    if (iVar23 == 5) goto LAB_00c5b086;
                    if (iVar23 != 0) goto LAB_00c5b11d;
                  }
                  goto LAB_00c5afc7;
                }
              }
              else {
                preferred_regs = 0;
                if (pTVar29 == (TCGTemp *)pTVar40->args[bVar18]) goto LAB_00c5afc7;
              }
LAB_00c5b086:
              temp_load(s,pTVar29,s->tcg_target_available_regs[(byte)pTVar29->field_0x3],
                        allocated_regs,0);
              TVar21 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar39 + 4 + lVar68 * 8),allocated_regs,TVar46
                                     ,((undefined1  [56])*pTVar29 & (undefined1  [56])0x400000000)
                                      != (undefined1  [56])0x0);
              pTVar62 = s;
              tcg_out_mov(s,*(TCGReg *)pTVar29 >> 0x18,TVar21,*(TCGReg *)pTVar29 & 0xff);
            }
            *(ulong *)((long)&stack0xfffffffffffffef8 + lVar68 * 8) = (ulong)TVar21;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar68 * 4) = 0;
            allocated_regs = allocated_regs | 1 << (TVar21 & TCG_REG_XMM15);
          }
LAB_00c5b11d:
          uVar72 = uVar72 + 1;
        } while (uVar72 != uVar50);
      }
      if (uVar50 != 0) {
        uVar72 = uVar30;
        do {
          if ((uVar66 >> ((byte)uVar72 & 0x1f) & 4) != 0) {
            pTVar62 = s;
            temp_free_or_dead(s,(TCGTemp *)pTVar40->args[uVar72],1);
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 < uVar50 + uVar30);
      }
      if (((&pTVar11->flags)[uVar71] & 2) == 0) {
        if (((&pTVar11->flags)[uVar71] & 4) != 0) {
          lVar39 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar39 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar39] != (TCGTemp *)0x0)) {
              pTVar62 = s;
              temp_sync(s,s->reg_to_temp[lVar39],allocated_regs,0,-1);
            }
            lVar39 = lVar39 + 1;
          } while (lVar39 != 0x20);
        }
        if (uVar30 != 0) {
          uVar50 = 0;
          do {
            lVar39 = *(long *)((long)&pTVar11->args_ct + uVar71);
            lVar73 = (long)*(int *)(*(long *)((long)&pTVar11->sorted_args + uVar71) + uVar50 * 4);
            pTVar29 = (TCGTemp *)pTVar40->args[lVar73];
            uVar5 = *(ushort *)(lVar39 + lVar73 * 8);
            if (((char)uVar5 < '\0') &&
               (uVar72 = (ulong)*(byte *)(lVar39 + 2 + lVar73 * 8),
               *(int *)((long)&stack0xffffffffffffff88 + uVar72 * 4) == 0)) {
              TVar21 = *(TCGReg *)((long)&stack0xfffffffffffffef8 + uVar72 * 8);
            }
            else {
              if ((uVar5 & 0x20) == 0) {
                TVar46 = pTVar40->output_pref[uVar50];
                uVar36 = TVar37;
              }
              else {
                uVar36 = TVar37 | allocated_regs;
                TVar46 = pTVar40->output_pref[uVar50];
              }
              pTVar62 = s;
              TVar21 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar39 + 4 + lVar73 * 8),uVar36,TVar46,
                                     ((undefined1  [56])*pTVar29 & (undefined1  [56])0x400000000) !=
                                     (undefined1  [56])0x0);
            }
            if (((uint)*(ulong *)pTVar29 & 0xff00) == 0x100) {
              ppTVar2[*(ulong *)pTVar29 & 0xff] = (TCGTemp *)0x0;
            }
            TVar37 = TVar37 | 1 << (TVar21 & TCG_REG_XMM15);
            *(ulong *)pTVar29 =
                 (*(ulong *)pTVar29 & 0xfffffff7ffff0000) + (ulong)(byte)TVar21 + 0x100;
            ppTVar2[TVar21] = pTVar29;
            *(ulong *)((long)&stack0xfffffffffffffef8 + lVar73 * 8) = (ulong)TVar21;
            uVar50 = uVar50 + 1;
          } while (uVar30 != uVar50);
        }
      }
      uVar54 = local_70;
      pTVar41 = local_f8;
      pTVar55 = local_100;
      pTVar49 = local_108;
      uVar36 = *(uint *)pTVar40;
      iVar23 = (int)in_R9;
      bVar18 = (byte)local_100;
      base = (TCGCond)local_100;
      r = (TCGCond)local_108;
      bVar65 = (byte)local_f8;
      TVar48 = (TCGCond)local_f8;
      bVar52 = (byte)local_108;
      if (((&pTVar11->flags)[uVar71] & 0x40) != 0) {
        if (0x2b < (uVar36 & 0xff) - 0x8d) {
switchD_00c5b3ca_caseD_93:
          pcVar25 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
          ;
          iVar23 = 0xb75;
LAB_00c5c95e:
          g_assertion_message_expr(pcVar25,iVar23,(char *)0x0);
        }
        uVar54 = uVar36 >> 0xc & 0xf;
        uVar50 = (ulong)uVar54;
        TVar57 = (uVar36 >> 8 & 0xf) + TCG_TYPE_V64;
        pTVar62 = local_f8;
        switch(uVar36 & 0xff) {
        case 0x8d:
          goto LAB_00c5bc2c;
        case 0x8e:
          goto LAB_00c5c30a;
        case 0x8f:
          in_R9 = local_f8;
          tcg_out_dupm_vec(s,TVar57,uVar54,r,base,(intptr_t)local_f8);
          goto LAB_00c5c314;
        case 0x90:
          uVar36 = *(uint *)(tcg_out_vec_op_add_insn + uVar50 * 4);
          goto LAB_00c5b9ce;
        case 0x91:
          puVar42 = tcg_out_vec_op_sub_insn;
          break;
        case 0x92:
          puVar42 = tcg_out_vec_op_mul_insn;
          break;
        default:
          goto switchD_00c5b3ca_caseD_93;
        case 0x94:
          uVar36 = *(uint *)(tcg_out_vec_op_abs_insn + uVar50 * 4);
          base = TCG_COND_NEVER;
          pTVar62 = local_100;
          goto LAB_00c5b9ce;
        case 0x95:
          puVar42 = tcg_out_vec_op_ssadd_insn;
          break;
        case 0x96:
          puVar42 = tcg_out_vec_op_usadd_insn;
          break;
        case 0x97:
          puVar42 = tcg_out_vec_op_sssub_insn;
          break;
        case 0x98:
          puVar42 = tcg_out_vec_op_ussub_insn;
          break;
        case 0x99:
          puVar42 = tcg_out_vec_op_smin_insn;
          break;
        case 0x9a:
          puVar42 = tcg_out_vec_op_umin_insn;
          break;
        case 0x9b:
          puVar42 = tcg_out_vec_op_smax_insn;
          break;
        case 0x9c:
          puVar42 = tcg_out_vec_op_umax_insn;
          break;
        case 0x9d:
          uVar36 = 0x5db;
          goto LAB_00c5b9ce;
        case 0x9e:
          uVar36 = 0x5eb;
          goto LAB_00c5b9ce;
        case 0x9f:
          uVar36 = 0x5ef;
          goto LAB_00c5b9ce;
        case 0xa0:
          uVar24 = (uint)(TVar57 == TCG_TYPE_V256) << 0x13 | 0x5df;
          goto LAB_00c5bf31;
        case 0xa3:
          iVar67 = 6;
          goto LAB_00c5b658;
        case 0xa4:
          iVar67 = 2;
          goto LAB_00c5b658;
        case 0xa5:
          iVar67 = 4;
LAB_00c5b658:
          uVar36 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar50 * 4) | 0x80000;
          if (TVar57 != TCG_TYPE_V256) {
            uVar36 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar50 * 4);
          }
          tcg_out_vex_opc(s,uVar36,iVar67,r,base,iVar23);
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = (bVar18 & 7) + (char)iVar67 * '\b' | 0xc0;
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = bVar65;
          goto LAB_00c5c314;
        case 0xa6:
          puVar42 = tcg_out_vec_op_shls_insn;
          break;
        case 0xa7:
          puVar42 = tcg_out_vec_op_shrs_insn;
          break;
        case 0xa8:
          puVar42 = tcg_out_vec_op_sars_insn;
          break;
        case 0xa9:
          puVar42 = tcg_out_vec_op_shlv_insn;
          break;
        case 0xaa:
          puVar42 = tcg_out_vec_op_shrv_insn;
          break;
        case 0xab:
          puVar42 = tcg_out_vec_op_sarv_insn;
          break;
        case 0xac:
          if (_local_f0 == TCG_COND_GT) {
            puVar42 = tcg_out_vec_op_cmpgt_insn;
          }
          else {
            if (_local_f0 != TCG_COND_EQ) {
              pcVar25 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ;
              iVar23 = 0xb20;
              goto LAB_00c5c95e;
            }
            puVar42 = tcg_out_vec_op_cmpeq_insn;
          }
          break;
        case 0xb0:
          uVar36 = 0x1c6;
          goto LAB_00c5b7fa;
        case 0xb1:
          tcg_out_vex_opc(s,(uint)(TVar57 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar48,iVar23);
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = (bVar65 & 7) + bVar52 * '\b' | 0xc0;
          tVar17 = local_f0 << 4;
          goto LAB_00c5c03c;
        case 0xb2:
          uVar36 = 0x1040e;
          if (uVar54 != 1) {
            if (uVar54 != 2) {
              pcVar25 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ;
              iVar23 = 0xb53;
              goto LAB_00c5c95e;
            }
            uVar36 = 0x1040c;
            if (have_avx2_riscv64 != false) {
              uVar36 = 0x10402;
            }
          }
          goto LAB_00c5b7fa;
        case 0xb3:
          puVar42 = tcg_out_vec_op_packss_insn;
          break;
        case 0xb4:
          puVar42 = tcg_out_vec_op_packus_insn;
          break;
        case 0xb5:
          tcg_out_vex_opc(s,0x573,3,r,base,iVar23);
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = bVar18 & 7 | 0xd8;
          goto LAB_00c5baa5;
        case 0xb6:
          uVar36 = 0x90446;
LAB_00c5b7fa:
          tVar17 = local_f0;
          uVar54 = uVar36 | 0x80000;
          if (TVar57 != TCG_TYPE_V256) {
            uVar54 = uVar36;
          }
          tcg_out_vex_opc(s,uVar54,r,base,TVar48,iVar23);
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = (bVar65 & 7) + bVar52 * '\b' | 0xc0;
          ptVar8 = s->code_ptr;
          s->code_ptr = ptVar8 + 1;
          *ptVar8 = tVar17;
          goto LAB_00c5c314;
        case 0xb7:
          puVar42 = tcg_out_vec_op_punpckl_insn;
          break;
        case 0xb8:
          puVar42 = tcg_out_vec_op_punpckh_insn;
        }
        uVar36 = *(uint *)(puVar42 + uVar50 * 4);
LAB_00c5b9ce:
        uVar54 = uVar36 | 0x80000;
        if (TVar57 != TCG_TYPE_V256) {
          uVar54 = uVar36;
        }
        tcg_out_vex_opc(s,uVar54,r,base,(int)pTVar62,iVar23);
        bVar18 = ((byte)pTVar62 & 7) + bVar52 * '\b';
LAB_00c5b9f7:
        pbVar32 = s->code_ptr;
        s->code_ptr = pbVar32 + 1;
        *pbVar32 = bVar18 | 0xc0;
        goto LAB_00c5c314;
      }
      uVar38 = (uVar36 & 0xff) - 3;
      if (0x85 < uVar38) {
switchD_00c5b36b_caseD_5:
        tcg_gen_code_riscv64_cold_21();
LAB_00c5c994:
        tcg_gen_code_riscv64_cold_2();
        uVar66 = pTVar62->nb_globals;
        uVar36 = pTVar62->nb_temps;
        uVar24 = uVar36 * 4 + 7;
        uVar54 = uVar36 * 4 + 0xe;
        if (-1 < (int)uVar24) {
          uVar54 = uVar24;
        }
        puVar33 = pTVar62->pool_cur;
        if (pTVar62->pool_end < puVar33 + (int)(uVar54 & 0xfffffff8)) {
          puVar33 = (uint8_t *)tcg_malloc_internal_riscv64(pTVar62,uVar54 & 0xfffffff8);
        }
        else {
          pTVar62->pool_cur = puVar33 + (int)(uVar54 & 0xfffffff8);
        }
        if (0 < (int)uVar36) {
          lVar39 = 0;
          do {
            *(uint8_t **)((long)&pTVar62->temps[0].state_ptr + lVar39) = puVar33;
            puVar33 = puVar33 + 4;
            lVar39 = lVar39 + 0x38;
          } while ((ulong)uVar36 * 0x38 - lVar39 != 0);
        }
        la_func_end(pTVar62,uVar66,uVar36);
        pQVar34 = ((pTVar62->ops).tqh_circ.tql_prev)->tql_prev;
        if ((TCGOp *)pQVar34->tql_next == (TCGOp *)0x0) goto LAB_00c5d0a9;
        lVar39 = (ulong)uVar66 * 0x38;
        pTVar40 = (TCGOp *)pQVar34->tql_next;
        do {
          pTVar6 = (TCGOp *)((pTVar40->link).tqe_circ.tql_prev)->tql_prev->tql_next;
          uVar54 = *(uint *)pTVar40;
          uVar24 = uVar54 & 0xff;
          uVar38 = uVar24 << 5;
          pTVar11 = pTVar62->tcg_op_defs;
          if (uVar24 < 0x7b) {
            if (0x27 < uVar24) {
              uVar58 = 0x13;
              if (1 < uVar24 - 0x29) {
                if (uVar24 == 0x28) {
                  uVar58 = 0x12;
                  goto LAB_00c5cb1e;
                }
                goto switchD_00c5cacb_caseD_7f;
              }
LAB_00c5cae1:
              pQVar43 = (QTailQLink *)&DAT_00000002;
              uVar63 = 2;
              if (*(long *)(pTVar40->args[1] + 0x28) == 1) {
                TVar45 = pTVar40->args[0];
                lVar73 = 0x30;
                goto LAB_00c5cb34;
              }
              goto LAB_00c5cb81;
            }
            if (uVar24 != 0) {
              if (uVar24 != 2) {
                uVar58 = 0x11;
                if (uVar24 == 0x27) goto LAB_00c5cb1e;
                goto switchD_00c5cacb_caseD_7f;
              }
              uVar24 = uVar54 >> 0xc & 0xf;
              uVar26 = (ulong)uVar24;
              uVar54 = uVar54 >> 8 & 0xf;
              TVar45 = pTVar40->args[(ulong)(uVar54 + uVar24) + 1];
              if ((TVar45 & 4) == 0) {
LAB_00c5cdb4:
                if (uVar24 == 0) {
                  uVar38 = 0;
                }
                else {
                  uVar30 = 0;
                  uVar38 = 0;
                  do {
                    TVar7 = pTVar40->args[uVar30];
                    uVar58 = 0;
                    if ((*(ulong *)(TVar7 + 0x28) & 1) != 0) {
                      uVar58 = 4 << ((byte)uVar30 & 0x1f);
                    }
                    uVar63 = 0;
                    if ((*(ulong *)(TVar7 + 0x28) & 2) != 0) {
                      uVar63 = 1 << ((byte)uVar30 & 0x1f);
                    }
                    uVar38 = uVar38 | uVar63 | uVar58;
                    *(undefined8 *)(TVar7 + 0x28) = 1;
                    **(undefined4 **)(TVar7 + 0x30) = 0;
                    pTVar40->output_pref[uVar30] = 0;
                    uVar30 = uVar30 + 1;
                  } while (uVar26 != uVar30);
                }
                uVar53 = (undefined2)uVar38;
                if ((TVar45 & 3) == 0) {
                  if (0 < (int)uVar66) {
                    lVar73 = 0;
                    do {
                      *(undefined8 *)((long)&pTVar62->temps[0].state + lVar73) = 3;
                      **(TCGRegSet **)((long)&pTVar62->temps[0].state_ptr + lVar73) =
                           pTVar62->tcg_target_available_regs
                           [(byte)(&pTVar62->temps[0].field_0x3)[lVar73]];
                      lVar73 = lVar73 + 0x38;
                    } while (lVar39 != lVar73);
                  }
                }
                else if ((TVar45 & 1) == 0) {
                  la_global_sync(pTVar62,uVar66);
                }
                uVar30 = uVar26;
                if (uVar54 != 0) {
                  do {
                    if ((pTVar40->args[uVar30] != 0) &&
                       ((*(byte *)(pTVar40->args[uVar30] + 0x28) & 1) != 0)) {
                      uVar38 = uVar38 | 4 << ((byte)uVar30 & 0x1f);
                    }
                    uVar53 = (undefined2)uVar38;
                    uVar30 = uVar30 + 1;
                  } while (uVar30 < uVar54 + uVar24);
                }
                la_cross_call(pTVar62,uVar36);
                pQVar34 = (QTailQLink *)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                if (uVar54 != 0) {
                  uVar30 = 0;
                  do {
                    TVar45 = pTVar40->args[uVar26 + uVar30];
                    if ((TVar45 != 0) && (uVar50 = *(ulong *)(TVar45 + 0x28), (uVar50 & 1) != 0)) {
                      TVar37 = 0;
                      if (5 < uVar30) {
                        TVar37 = pTVar62->tcg_target_available_regs[*(byte *)(TVar45 + 3)];
                      }
                      **(TCGRegSet **)(TVar45 + 0x30) = TVar37;
                      *(ulong *)(TVar45 + 0x28) = uVar50 & 0xfffffffffffffffe;
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar54 != uVar30);
                  if (5 < uVar54) {
                    uVar54 = 6;
                  }
                  uVar30 = 0;
                  do {
                    lVar73 = *(long *)((long)pTVar40->args + uVar30 * 2 + uVar26 * 8);
                    if (lVar73 != 0) {
                      puVar14 = *(uint **)(lVar73 + 0x30);
                      *puVar14 = *puVar14 |
                                 1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar30) & 0x1f);
                    }
                    uVar30 = uVar30 + 4;
                  } while (uVar54 << 2 != uVar30);
                }
              }
              else {
                if (uVar24 != 0) {
                  uVar30 = 0;
                  do {
                    if (*(long *)(pTVar40->args[uVar30] + 0x28) != 1) goto LAB_00c5cdb4;
                    uVar30 = uVar30 + 1;
                  } while (uVar26 != uVar30);
                }
                uVar53 = 0;
                pQVar34 = (QTailQLink *)0x0;
              }
              if ((char)pQVar34 != '\0') goto LAB_00c5ce49;
              goto LAB_00c5cb3d;
            }
            TVar45 = pTVar40->args[0];
            *(undefined8 *)(TVar45 + 0x28) = 1;
            pQVar34 = *(QTailQLink **)(TVar45 + 0x30);
            *(undefined4 *)&pQVar34->tql_next = 0;
switchD_00c5cacb_caseD_81:
            uVar53 = 0;
          }
          else {
            if (uVar24 - 0x7b < 7) {
              pQVar34 = (QTailQLink *)
                        ((long)&switchD_00c5cacb::switchdataD_00dc4078 +
                        (long)(int)(&switchD_00c5cacb::switchdataD_00dc4078)[uVar24 - 0x7b]);
              switch(uVar24) {
              case 0x7b:
                uVar58 = 0x4e;
                break;
              case 0x7c:
                uVar58 = 0x4f;
                break;
              default:
                uVar58 = 0x50;
                goto LAB_00c5cae1;
              case 0x7f:
              case 0x80:
                goto switchD_00c5cacb_caseD_7f;
              case 0x81:
                goto switchD_00c5cacb_caseD_81;
              }
LAB_00c5cb1e:
              if (*(long *)(pTVar40->args[1] + 0x28) == 1) {
                TVar45 = pTVar40->args[0];
                lVar73 = 0x38;
LAB_00c5cb34:
                if (*(long *)(TVar45 + 0x28) == 1) goto LAB_00c5cb3b;
                *(uint *)pTVar40 = uVar54 & 0xffffff00 | uVar58;
                pTVar40->args[1] = pTVar40->args[2];
                pTVar40->args[2] = *(TCGArg *)((long)pTVar40->args + lVar73 + -0x18);
                uVar63 = 2;
                pQVar43 = (QTailQLink *)&DAT_00000001;
                uVar24 = uVar58;
              }
              else {
                uVar63 = 4;
                pQVar43 = (QTailQLink *)&DAT_00000002;
              }
            }
            else {
switchD_00c5cacb_caseD_7f:
              bVar18 = (&pTVar11->nb_oargs)[uVar38];
              pQVar43 = (QTailQLink *)(ulong)bVar18;
              uVar63 = (uint)(&pTVar11->nb_iargs)[uVar38];
              if (bVar18 != 0 && ((&pTVar11->flags)[uVar38] & 8) == 0) {
                uVar26 = 0;
                do {
                  if (*(long *)(pTVar40->args[uVar26] + 0x28) != 1) goto LAB_00c5cb81;
                  uVar26 = uVar26 + 1;
                } while (bVar18 != uVar26);
LAB_00c5cb3b:
                uVar53 = 0;
LAB_00c5cb3d:
                tcg_op_remove_riscv64(pTVar62,pTVar40);
                pQVar34 = extraout_RAX;
                goto LAB_00c5ce49;
              }
            }
LAB_00c5cb81:
            if ((char)pQVar43 == '\0') {
              uVar54 = 0;
            }
            else {
              pQVar34 = (QTailQLink *)0x0;
              uVar54 = 0;
              do {
                TVar45 = pTVar40->args[(long)pQVar34];
                pTVar13 = *(TCGRegSet **)(TVar45 + 0x30);
                pTVar40->output_pref[(long)pQVar34] = *pTVar13;
                uVar58 = 4 << ((byte)pQVar34 & 0x1f);
                if ((*(ulong *)(TVar45 + 0x28) & 1) == 0) {
                  uVar58 = 0;
                }
                uVar70 = 1 << ((byte)pQVar34 & 0x1f);
                if ((*(ulong *)(TVar45 + 0x28) & 2) == 0) {
                  uVar70 = 0;
                }
                uVar54 = uVar54 | uVar70 | uVar58;
                *(undefined8 *)(TVar45 + 0x28) = 1;
                *pTVar13 = 0;
                pQVar34 = (QTailQLink *)((long)&pQVar34->tql_next + 1);
              } while (pQVar43 != pQVar34);
            }
            bVar18 = (&pTVar11->flags)[uVar38];
            if ((bVar18 & 1) == 0) {
              if ((bVar18 & 2) == 0) {
                if (((bVar18 & 8) != 0) &&
                   (la_global_sync(pTVar62,uVar66), ((&pTVar11->flags)[uVar38] & 4) != 0)) {
                  la_cross_call(pTVar62,uVar36);
                }
              }
              else if (uVar24 == 0x26) {
                if (0 < (int)uVar66) {
                  lVar73 = 0;
                  do {
                    pbVar32 = (byte *)((long)&pTVar62->temps[0].state + lVar73);
                    *pbVar32 = *pbVar32 | 2;
                    lVar73 = lVar73 + 0x38;
                  } while (lVar39 != lVar73);
                }
              }
              else {
                if (0 < (int)uVar66) {
                  lVar73 = 0;
                  do {
                    *(undefined8 *)((long)&pTVar62->temps[0].state + lVar73) = 3;
                    **(TCGRegSet **)((long)&pTVar62->temps[0].state_ptr + lVar73) =
                         pTVar62->tcg_target_available_regs
                         [(byte)(&pTVar62->temps[0].field_0x3)[lVar73]];
                    lVar73 = lVar73 + 0x38;
                  } while (lVar39 != lVar73);
                }
                ppvVar35 = &pTVar62->temps[(int)uVar66].state_ptr;
                lVar73 = (long)(int)uVar36 - (long)(int)uVar66;
                if ((int)uVar66 < (int)uVar36) {
                  do {
                    uVar26 = *(ulong *)(ppvVar35 + -6) & 0x4000000000;
                    TVar37 = 0;
                    ppvVar35[-1] = (void *)((uVar26 >> 0x26) * 2 + 1);
                    if (uVar26 != 0) {
                      TVar37 = pTVar62->tcg_target_available_regs
                               [*(ulong *)(ppvVar35 + -6) >> 0x18 & 0xff];
                    }
                    *(TCGRegSet *)*ppvVar35 = TVar37;
                    ppvVar35 = ppvVar35 + 7;
                    lVar73 = lVar73 + -1;
                  } while (lVar73 != 0);
                }
              }
            }
            else {
              la_func_end(pTVar62,uVar66,uVar36);
            }
            pQVar34 = (QTailQLink *)(ulong)((int)pQVar43 + uVar63);
            pQVar44 = pQVar43;
            if (uVar63 != 0) {
              do {
                uVar58 = 0;
                if ((*(byte *)(pTVar40->args[(long)pQVar44] + 0x28) & 1) != 0) {
                  uVar58 = 4 << ((byte)pQVar44 & 0x1f);
                }
                uVar54 = uVar54 | uVar58;
                pQVar44 = (QTailQLink *)((long)&pQVar44->tql_next + 1);
              } while (pQVar44 < pQVar34);
            }
            uVar53 = (undefined2)uVar54;
            pQVar44 = pQVar43;
            if (uVar63 != 0) {
              do {
                TVar45 = pTVar40->args[(long)pQVar44];
                uVar26 = *(ulong *)(TVar45 + 0x28);
                if ((uVar26 & 1) != 0) {
                  **(TCGRegSet **)(TVar45 + 0x30) =
                       pTVar62->tcg_target_available_regs[*(byte *)(TVar45 + 3)];
                  *(ulong *)(TVar45 + 0x28) = uVar26 & 0xfffffffffffffffe;
                }
                pQVar44 = (QTailQLink *)((long)&pQVar44->tql_next + 1);
              } while (pQVar44 < pQVar34);
            }
            if ((uVar24 == 5) || (uVar24 == 0x3f)) {
              if ((uVar54 & 8) != 0) {
                pQVar34 = *(QTailQLink **)(pTVar40->args[0] + 0x30);
                *(undefined4 *)&pQVar34->tql_next = **(undefined4 **)(pTVar40->args[1] + 0x30);
              }
            }
            else if (uVar63 != 0) {
              lVar73 = *(long *)((long)&pTVar11->args_ct + (ulong)uVar38);
              do {
                puVar14 = *(uint **)(pTVar40->args[(long)pQVar43] + 0x30);
                uVar54 = *(uint *)(lVar73 + 4 + (long)pQVar43 * 8);
                uVar24 = *puVar14 & uVar54;
                if ((*(byte *)(lVar73 + (long)pQVar43 * 8) & 0x40) != 0) {
                  uVar24 = uVar24 & pTVar40->output_pref[*(byte *)(lVar73 + 2 + (long)pQVar43 * 8)];
                }
                if (uVar24 != 0) {
                  uVar54 = uVar24;
                }
                *puVar14 = uVar54;
                pQVar43 = (QTailQLink *)((long)&pQVar43->tql_next + 1);
              } while (pQVar43 < pQVar34);
            }
          }
LAB_00c5ce49:
          *(undefined2 *)&pTVar40->field_0x2 = uVar53;
          pTVar40 = pTVar6;
          if (pTVar6 == (TCGOp *)0x0) {
LAB_00c5d0a9:
            return (int)pQVar34;
          }
        } while( true );
      }
      pTVar64 = (TCGContext_conflict11 *)(ulong)local_70;
      iVar22 = 0x402f7;
      pTVar51 = (TCGContext_conflict11 *)0x5;
      iVar47 = 5;
      uVar70 = 0;
      uVar24 = 0;
      TVar57 = TCG_TYPE_I32;
      uVar58 = 0;
      pTVar16 = (TCGContext_conflict11 *)0x0;
      iVar67 = 5;
      uVar63 = 0;
      switch(uVar36 & 0xff) {
      case 3:
        tcg_out_jxx(s,-1,(TCGLabel *)local_108,
                    (&switchD_00c5b36b::switchdataD_00dc3e40)[uVar38] + 0xdc3e40);
        break;
      case 4:
        tcg_out_mb(s,(TCGArg)local_108);
        break;
      default:
        goto switchD_00c5b36b_caseD_5;
      case 7:
        tcg_out_setcond32(s,_local_f0,(TCGArg)local_108,(TCGArg)local_100,(TCGArg)local_f8,local_70)
        ;
        in_R9 = pTVar64;
        break;
      case 8:
        in_stack_fffffffffffffe68 = (TCGContext_conflict11 *)(ulong)_local_f0;
        tcg_out_movcond32(s,local_e0,r,base,(TCGArg)local_f8,local_70,_local_f0);
        in_R9 = pTVar64;
        break;
      case 9:
      case 0x43:
        iVar23 = 0x1b6;
        goto LAB_00c5bfd3;
      case 10:
        iVar23 = 0x1be;
        goto LAB_00c5bfd3;
      case 0xb:
      case 0x45:
        iVar23 = 0x1b7;
        goto LAB_00c5bfd3;
      case 0xc:
        iVar23 = 0x1bf;
        goto LAB_00c5bfd3;
      case 0xd:
      case 0x47:
        TVar57 = TCG_TYPE_I32;
        goto LAB_00c5bc2c;
      case 0xe:
      case 0x4a:
        if (local_78 == 0) {
          iVar23 = 0x2088;
          goto LAB_00c5bfd3;
        }
        tcg_out_modrm_offset(s,0xc6,0,base,(intptr_t)local_f8);
        pbVar32 = s->code_ptr;
        s->code_ptr = pbVar32 + 1;
        *pbVar32 = bVar52;
        break;
      case 0xf:
      case 0x4b:
        if (local_78 == 0) {
          iVar23 = 0x489;
          goto LAB_00c5bfd3;
        }
        tcg_out_modrm_offset(s,0x4c7,0,base,(intptr_t)local_f8);
        ptVar8 = s->code_ptr;
        *(short *)ptVar8 = (short)pTVar49;
        pTVar31 = (TCGCond *)(ptVar8 + 2);
        goto LAB_00c5c28e;
      case 0x10:
      case 0x4c:
        if (local_78 != 0) {
          iVar23 = 199;
          goto LAB_00c5bcaf;
        }
        TVar57 = TCG_TYPE_I32;
LAB_00c5c30a:
        tcg_out_st(s,TVar57,r,base,(intptr_t)local_f8);
        break;
      case 0x11:
        goto switchD_00c5b36b_caseD_11;
      case 0x12:
        goto switchD_00c5b36b_caseD_12;
      case 0x13:
        goto switchD_00c5b36b_caseD_13;
      case 0x18:
        goto switchD_00c5b36b_caseD_18;
      case 0x19:
        goto switchD_00c5b36b_caseD_19;
      case 0x1a:
        iVar47 = 4;
        uVar24 = 0;
        goto switchD_00c5b36b_caseD_12;
      case 0x1b:
        iVar47 = 1;
        goto switchD_00c5b36b_caseD_12;
      case 0x1c:
        iVar47 = 6;
        goto switchD_00c5b36b_caseD_12;
      case 0x1d:
        goto switchD_00c5b36b_caseD_1d;
      case 0x1e:
        goto switchD_00c5b36b_caseD_1e;
      case 0x1f:
        uVar24 = 0;
        goto LAB_00c5bdf5;
      case 0x20:
        goto switchD_00c5b36b_caseD_20;
      case 0x21:
        pTVar16 = (TCGContext_conflict11 *)&DAT_00000001;
switchD_00c5b36b_caseD_20:
        pTVar51 = pTVar16;
        uVar24 = 0;
        goto LAB_00c5bed5;
      case 0x22:
      case 0x5f:
        lVar39 = CONCAT44(uStack_ec,_local_f0);
        uVar50 = CONCAT44(uStack_e4,local_e8) ^ 8;
        if (lVar39 == 0 && uVar50 == 0) {
          tcg_gen_code_riscv64_cold_9();
          break;
        }
        if (lVar39 == 8 && uVar50 == 0) {
          tcg_gen_code_riscv64_cold_4();
          break;
        }
        if ((lVar39 == 0) && (CONCAT44(uStack_e4,local_e8) == 0x10)) {
          tcg_gen_code_riscv64_cold_8();
          break;
        }
        goto LAB_00c5c994;
      case 0x23:
switchD_00c5b36b_caseD_23:
        if ((TCGContext_conflict11 *)0x7 < local_108 || (TCGContext_conflict11 *)0x3 < local_100) {
          tcg_out_ext16u(s,r,base);
          iVar23 = 5;
LAB_00c5c2d3:
          TVar48 = TCG_COND_EQ;
          goto LAB_00c5c2da;
        }
        iVar23 = 0x1b6;
        goto LAB_00c5bd96;
      case 0x24:
        if ((TCGContext_conflict11 *)0x7 < local_108 || (TCGContext_conflict11 *)0x3 < local_100) {
          tcg_out_opc(s,0x1bf,r,base,0);
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = (bVar18 & 7) + bVar52 * '\b' | 0xc0;
          iVar23 = 7;
          goto LAB_00c5c2d3;
        }
        iVar23 = 0x1be;
LAB_00c5bd96:
        tcg_out_opc(s,iVar23,r,base | TCG_COND_LTU,0);
        bVar18 = bVar18 + bVar52 * '\b' + 4;
        goto LAB_00c5bf3c;
      case 0x25:
        iVar23 = 0x1ac;
        goto LAB_00c5c005;
      case 0x26:
        in_R9 = (TCGContext_conflict11 *)CONCAT44(uStack_ec,_local_f0);
        tcg_out_brcond32(s,TVar48,(TCGArg)local_108,(TCGArg)local_100,local_74,(TCGLabel *)in_R9,
                         (int)in_stack_fffffffffffffe68);
        break;
      case 0x27:
        goto switchD_00c5b36b_caseD_27;
      case 0x28:
        goto switchD_00c5b36b_caseD_28;
      case 0x29:
        goto switchD_00c5b36b_caseD_29;
      case 0x2a:
        goto switchD_00c5b36b_caseD_2a;
      case 0x2f:
        goto switchD_00c5b36b_caseD_2f;
      case 0x30:
        goto switchD_00c5b36b_caseD_30;
      case 0x31:
      case 0x6b:
        tcg_out_ext8u(s,r,base);
        break;
      case 0x32:
      case 0x6c:
        tcg_out_ext16u(s,r,base);
        break;
      case 0x33:
      case 0x6e:
        tcg_out_rolw_8(s,r);
        break;
      case 0x34:
      case 0x6f:
        tcg_gen_code_riscv64_cold_15();
        break;
      case 0x35:
        goto switchD_00c5b36b_caseD_35;
      case 0x36:
        goto switchD_00c5b36b_caseD_36;
      case 0x37:
        uVar70 = 0;
        goto LAB_00c5bf89;
      case 0x3c:
        goto switchD_00c5b36b_caseD_3c;
      case 0x3d:
        goto switchD_00c5b36b_caseD_3d;
      case 0x3e:
        goto LAB_00c5c510;
      case 0x41:
        tcg_out_setcond64(s,_local_f0,(TCGArg)local_108,(TCGArg)local_100,(TCGArg)local_f8,local_70)
        ;
        in_R9 = pTVar64;
        break;
      case 0x42:
        in_stack_fffffffffffffe68 = (TCGContext_conflict11 *)(ulong)_local_f0;
        tcg_out_movcond64(s,local_e0,r,base,(TCGArg)local_f8,local_70,_local_f0);
        in_R9 = pTVar64;
        break;
      case 0x44:
        iVar23 = 0x11be;
        goto LAB_00c5bfd3;
      case 0x46:
        iVar23 = 0x11bf;
        goto LAB_00c5bfd3;
      case 0x48:
        iVar23 = 0x1063;
LAB_00c5bfd3:
        tcg_out_modrm_offset(s,iVar23,r,base,(intptr_t)local_f8);
        break;
      case 0x49:
        TVar57 = TCG_TYPE_I64;
LAB_00c5bc2c:
        tcg_out_ld(s,TVar57,r,base,(intptr_t)local_f8);
        break;
      case 0x4d:
        if (local_78 == 0) {
          TVar57 = TCG_TYPE_I64;
          goto LAB_00c5c30a;
        }
        iVar23 = 0x10c7;
LAB_00c5bcaf:
        tcg_out_modrm_offset(s,iVar23,0,base,(intptr_t)local_f8);
        pTVar31 = (TCGCond *)s->code_ptr;
        *pTVar31 = r;
        goto LAB_00c5c28a;
      case 0x4e:
        uVar70 = 0x1000;
switchD_00c5b36b_caseD_11:
        iVar47 = 0;
        uVar24 = uVar70;
        if (local_108 == local_100) goto switchD_00c5b36b_caseD_12;
        if (local_70 == 0) {
          TVar48 = base;
          if (local_108 == local_f8) {
LAB_00c5c24c:
            tgen_arithr(s,uVar70,r,TVar48);
            break;
          }
          in_stack_fffffffffffffe68 = (TCGContext_conflict11 *)0x0;
          pTVar62 = local_f8;
        }
        else {
          in_stack_fffffffffffffe68 = local_f8;
          pTVar62 = (TCGContext_conflict11 *)0xffffffffffffffff;
        }
        in_R9 = (TCGContext_conflict11 *)0x0;
        tcg_out_modrm_sib_offset
                  (s,uVar70 | 0x8d,r,base,(int)pTVar62,0,(intptr_t)in_stack_fffffffffffffe68);
        break;
      case 0x4f:
        goto switchD_00c5b36b_caseD_4f;
      case 0x50:
        uVar58 = 0x1000;
switchD_00c5b36b_caseD_13:
        if (local_70 != 0) {
          bVar18 = (bVar52 & 7) + bVar52 * '\b' | 0xc0;
          if (TVar48 == (int)(char)bVar65) {
            tcg_out_opc(s,uVar58 | 0x6b,r,r,0);
            pbVar32 = s->code_ptr;
            s->code_ptr = pbVar32 + 1;
            *pbVar32 = bVar18;
LAB_00c5baa5:
            pbVar32 = s->code_ptr;
            s->code_ptr = pbVar32 + 1;
            *pbVar32 = bVar65;
          }
          else {
            tcg_out_opc(s,uVar58 | 0x69,r,r,0);
            pbVar32 = s->code_ptr;
            s->code_ptr = pbVar32 + 1;
            *pbVar32 = bVar18;
            pTVar31 = (TCGCond *)s->code_ptr;
            *pTVar31 = TVar48;
LAB_00c5c28a:
            pTVar31 = pTVar31 + 1;
LAB_00c5c28e:
            s->code_ptr = (tcg_insn_unit *)pTVar31;
          }
          break;
        }
        uVar58 = uVar58 | 0x1af;
        goto LAB_00c5be78;
      case 0x55:
switchD_00c5b36b_caseD_18:
        tcg_gen_code_riscv64_cold_18();
        break;
      case 0x56:
switchD_00c5b36b_caseD_19:
        tcg_gen_code_riscv64_cold_17();
        break;
      case 0x57:
        iVar67 = 4;
        goto switchD_00c5b36b_caseD_4f;
      case 0x58:
        iVar67 = 1;
        goto switchD_00c5b36b_caseD_4f;
      case 0x59:
        iVar67 = 6;
switchD_00c5b36b_caseD_4f:
        iVar47 = iVar67;
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_12:
        uVar24 = uVar24 + iVar47;
        if (local_70 == 0) {
          uVar58 = (uVar24 & 0xfffffff8) + (uVar24 & 7) * 8 + 3;
LAB_00c5be78:
          tcg_out_opc(s,uVar58,r,TVar48,0);
LAB_00c5bf36:
          bVar18 = ((byte)TVar48 & 7) + bVar52 * '\b';
LAB_00c5bf3c:
          pbVar32 = s->code_ptr;
          s->code_ptr = pbVar32 + 1;
          *pbVar32 = bVar18 | 0xc0;
        }
        else {
          tgen_arithi(s,uVar24,r,(tcg_target_long)local_f8,0);
        }
        break;
      case 0x5a:
        uVar63 = 0x1000;
switchD_00c5b36b_caseD_1d:
        uVar24 = uVar63;
        pTVar51 = (TCGContext_conflict11 *)0x4;
        iVar22 = 0x6f7;
        if ((local_108 == local_100 || local_70 == 0) ||
           (&DAT_00000002 < (undefined1 *)((long)local_f8[-1].regs + 0x7f)))
        goto switchD_00c5b36b_caseD_1e;
        if (local_f8 == (TCGContext_conflict11 *)&DAT_00000001) {
          in_R9 = (TCGContext_conflict11 *)0x0;
          TVar48 = base;
        }
        else {
          in_R9 = (TCGContext_conflict11 *)((ulong)local_f8 & 0xffffffff);
          TVar48 = ~TCG_COND_NEVER;
        }
        in_stack_fffffffffffffe68 = (TCGContext_conflict11 *)0x0;
        tcg_out_modrm_sib_offset(s,uVar24 | 0x8d,r,TVar48,base,(int)in_R9,0);
        break;
      case 0x5b:
        uVar24 = 0x1000;
        goto switchD_00c5b36b_caseD_1e;
      case 0x5c:
        uVar24 = 0x1000;
LAB_00c5bdf5:
        pTVar51 = (TCGContext_conflict11 *)0x7;
        iVar22 = 0x202f7;
switchD_00c5b36b_caseD_1e:
        if (have_bmi2 != true) {
LAB_00c5bed5:
          if (uVar54 != 0) {
            tcg_out_shifti(s,(int)pTVar51 + uVar24,r,TVar48);
            break;
          }
          tcg_out_opc(s,uVar24 + 0xd3,(int)pTVar51,r,0);
          pTVar55 = pTVar49;
LAB_00c5bf10:
          bVar18 = ((byte)pTVar55 & 7) + (char)pTVar51 * '\b';
          goto LAB_00c5b9f7;
        }
        if (local_70 != 0) {
          tcg_out_mov(s,(uint)(uVar24 != 0),r,base);
          goto LAB_00c5bed5;
        }
        uVar24 = uVar24 + iVar22;
LAB_00c5bf31:
        tcg_out_vex_opc(s,uVar24,r,TVar48,base,iVar23);
        TVar48 = base;
        goto LAB_00c5bf36;
      case 0x5d:
        goto switchD_00c5b36b_caseD_5d;
      case 0x5e:
        pTVar16 = (TCGContext_conflict11 *)&DAT_00000001;
switchD_00c5b36b_caseD_5d:
        pTVar51 = pTVar16;
        uVar24 = 0x1000;
        goto LAB_00c5bed5;
      case 0x60:
        if ((undefined1 *)((long)&local_f8->pool_cur + CONCAT44(uStack_ec,_local_f0)) !=
            (undefined1 *)0x20) goto switchD_00c5b36b_caseD_23;
        tcg_out_mov(s,TCG_TYPE_I32,r,base);
        iVar23 = 5;
        goto LAB_00c5c2da;
      case 0x62:
        iVar23 = 0x11ac;
LAB_00c5c005:
        tcg_out_opc(s,iVar23,TVar48,r,0);
        pbVar32 = s->code_ptr;
        s->code_ptr = pbVar32 + 1;
        *pbVar32 = (bVar52 & 7) + bVar65 * '\b' | 0xc0;
        tVar17 = local_f0;
LAB_00c5c03c:
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = tVar17;
        break;
      case 99:
      case 0x6a:
        tcg_out_ext32s(s,r,base);
        break;
      case 100:
      case 0x65:
      case 0x6d:
        tcg_gen_code_riscv64_cold_5();
        break;
      case 0x66:
        iVar23 = 0x1005;
        TVar48 = 0x20;
LAB_00c5c2da:
        tcg_out_shifti(s,iVar23,r,TVar48);
        break;
      case 0x67:
        in_R9 = (TCGContext_conflict11 *)CONCAT44(uStack_ec,_local_f0);
        tcg_out_brcond64(s,TVar48,(TCGArg)local_108,(TCGArg)local_100,local_74,(TCGLabel *)in_R9,
                         (int)in_stack_fffffffffffffe68);
        break;
      case 0x68:
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_2f:
        tcg_out_ext8s(s,r,base,uVar24);
        break;
      case 0x69:
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_30:
        tcg_out_ext16s(s,r,base,uVar24);
        break;
      case 0x70:
        tcg_gen_code_riscv64_cold_10();
        break;
      case 0x71:
switchD_00c5b36b_caseD_35:
        tcg_gen_code_riscv64_cold_13();
        break;
      case 0x72:
switchD_00c5b36b_caseD_36:
        tcg_gen_code_riscv64_cold_14();
        break;
      case 0x73:
        uVar70 = 0x1000;
        TVar57 = TCG_TYPE_I64;
LAB_00c5bf89:
        if (local_70 != 0) {
          tcg_out_mov(s,TVar57,r,base);
          uVar70 = uVar70 | 4;
          uVar50 = ~(ulong)pTVar41;
          iVar23 = 0;
          goto LAB_00c5c238;
        }
        tcg_out_vex_opc(s,uVar70 | 0x2f2,r,TVar48,base,iVar23);
        pTVar51 = pTVar49;
        goto LAB_00c5bf10;
      case 0x78:
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_3c:
        in_R9 = (TCGContext_conflict11 *)(ulong)(local_70 != 0);
        tcg_out_clz(s,uVar24,r,base,(TCGArg)local_f8,local_70 != 0);
        break;
      case 0x79:
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_3d:
        in_R9 = (TCGContext_conflict11 *)(ulong)(local_70 != 0);
        tcg_out_ctz(s,uVar24,r,base,(TCGArg)local_f8,local_70 != 0);
        break;
      case 0x7a:
LAB_00c5c510:
        tcg_gen_code_riscv64_cold_16();
        break;
      case 0x7b:
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_27:
        if (local_68 == 0) {
          tgen_arithr(s,uVar24,r,local_e8);
        }
        else {
          tgen_arithi(s,uVar24,r,CONCAT44(uStack_e4,local_e8),1);
        }
        uVar70 = uVar24 | 2;
        TVar48 = local_e0;
        r = base;
        if (local_64 != 0) {
          uVar50 = CONCAT44(uStack_dc,local_e0);
LAB_00c5c232:
          iVar23 = 1;
          r = base;
LAB_00c5c238:
          tgen_arithi(s,uVar70,r,uVar50,iVar23);
          break;
        }
        goto LAB_00c5c24c;
      case 0x7c:
        uVar24 = 0x1000;
switchD_00c5b36b_caseD_28:
        if (local_68 == 0) {
          tgen_arithr(s,uVar24 | 5,r,local_e8);
        }
        else {
          tgen_arithi(s,uVar24 | 5,r,CONCAT44(uStack_e4,local_e8),1);
        }
        uVar70 = uVar24 | 3;
        TVar48 = local_e0;
        r = base;
        if (local_64 != 0) {
          uVar50 = CONCAT44(uStack_dc,local_e0);
          goto LAB_00c5c232;
        }
        goto LAB_00c5c24c;
      case 0x7d:
switchD_00c5b36b_caseD_29:
        tcg_gen_code_riscv64_cold_12();
        break;
      case 0x7e:
switchD_00c5b36b_caseD_2a:
        tcg_gen_code_riscv64_cold_11();
        break;
      case 0x82:
        tcg_gen_code_riscv64_cold_7();
        break;
      case 0x83:
        if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
          tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + (long)local_108));
        }
        else {
          tcg_gen_code_riscv64_cold_3();
        }
        set_jmp_reset_offset(s,r);
        break;
      case 0x84:
        tcg_gen_code_riscv64_cold_6();
        break;
      case 0x85:
        _Var19 = false;
        goto LAB_00c5c083;
      case 0x86:
        _Var19 = false;
        goto LAB_00c5c0dc;
      case 0x87:
        _Var19 = true;
LAB_00c5c083:
        tcg_out_qemu_ld(s,(TCGArg *)&stack0xfffffffffffffef8,_Var19);
        break;
      case 0x88:
        _Var19 = true;
LAB_00c5c0dc:
        tcg_out_qemu_st(s,(TCGArg *)&stack0xfffffffffffffef8,_Var19);
      }
LAB_00c5c314:
      if (uVar30 != 0) {
        uVar50 = 0;
        do {
          uVar36 = 4 << ((byte)uVar50 & 0x1f) & uVar66;
          if ((uVar66 >> ((uint)uVar50 & 0x1f) & 1) == 0) {
            if (uVar36 != 0) {
              temp_free_or_dead(s,(TCGTemp *)pTVar40->args[uVar50],1);
            }
          }
          else {
            temp_sync(s,(TCGTemp *)pTVar40->args[uVar50],TVar37,0,uVar36);
          }
          uVar50 = uVar50 + 1;
        } while (uVar30 != uVar50);
      }
      unaff_R12 = unaff_R12 & 0xffffffff;
LAB_00c5accd:
      if (s->code_gen_highwater < s->code_ptr) {
        unaff_R12 = 0xffffffff;
        bVar77 = false;
      }
      else {
        bVar77 = (ulong)((long)s->code_ptr - (long)s->code_buf) < 0x10000;
        unaff_R12 = unaff_R12 & 0xffffffff;
        if (!bVar77) {
          unaff_R12 = 0xfffffffe;
        }
      }
      if (!bVar77) {
        return (int)unaff_R12;
      }
      pTVar40 = (pTVar40->link).tqe_next;
    } while (pTVar40 != (TCGOp *)0x0);
  }
  s->gen_insn_end_off[uVar26] =
       (short)*(undefined4 *)&s->code_ptr - (short)*(undefined4 *)&s->code_buf;
  pTVar69 = (s->ldst_labels).sqh_first;
  if (pTVar69 == (TCGLabelQemuLdst *)0x0) {
    bVar77 = false;
    iVar23 = 0;
  }
  else {
    do {
      uVar66 = pTVar69->oi;
      uVar36 = uVar66 >> 4;
      if (pTVar69->is_ld != true) {
        *(int *)pTVar69->label_ptr[0] = (*(int *)&s->code_ptr - (int)pTVar69->label_ptr[0]) + -4;
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'H';
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 0x8b;
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 0xfd;
        tcg_out_mov(s,(uint)((~uVar66 & 0x30) == 0),TCG_REG_EDX,pTVar69->datalo_reg);
        tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar66);
        tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar69->raddr);
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'A';
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'P';
        pptVar74 = (tcg_insn_unit **)(qemu_st_helpers + (uVar36 & 0xb));
        goto LAB_00c5c82b;
      }
      uVar54 = (uint)(pTVar69->type == TCG_TYPE_I64) << 0xc;
      *(int *)pTVar69->label_ptr[0] = (*(int *)&s->code_ptr - (int)pTVar69->label_ptr[0]) + -4;
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 'H';
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 0x8b;
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 0xfd;
      tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar66);
      pptVar74 = &pTVar69->raddr;
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar69->raddr);
      tcg_out_branch(s,1,(tcg_insn_unit *)qemu_ld_helpers[uVar36 & 0xb]);
      TVar21 = pTVar69->datalo_reg;
      switch(uVar36 & 7) {
      default:
        TVar57 = TCG_TYPE_I32;
        break;
      case 3:
        TVar57 = TCG_TYPE_I64;
        break;
      case 4:
        uVar54 = uVar54 | 0x41be;
        goto LAB_00c5c7fc;
      case 5:
        uVar54 = uVar54 | 0x1bf;
LAB_00c5c7fc:
        tcg_out_opc(s,uVar54,TVar21,0,0);
        pbVar32 = s->code_ptr;
        s->code_ptr = pbVar32 + 1;
LAB_00c5c828:
        *pbVar32 = (byte)TVar21 << 3 | 0xc0;
        goto LAB_00c5c82b;
      case 6:
        pbVar32 = *pptVar3;
        *pptVar3 = pbVar32 + 1;
        *pbVar32 = (byte)TVar21 >> 1 & 4 | 0x48;
        ptVar8 = *pptVar3;
        *pptVar3 = ptVar8 + 1;
        *ptVar8 = 'c';
        pbVar32 = *pptVar3;
        *pptVar3 = pbVar32 + 1;
        goto LAB_00c5c828;
      case 7:
switchD_00c5c6b7_caseD_7:
        tcg_gen_code_riscv64_cold_22();
LAB_00c5c933:
        __assert_fail("s->gen_insn_end_off[num_insns] == off",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                      ,0xedf,"int tcg_gen_code_riscv64(TCGContext *, TranslationBlock *)");
      }
      tcg_out_mov(s,TVar57,TVar21,TCG_REG_EAX);
LAB_00c5c82b:
      tcg_out_branch(s,0,*pptVar74);
      bVar77 = s->code_gen_highwater < s->code_ptr;
      if (s->code_gen_highwater < s->code_ptr) {
        iVar23 = -1;
        goto LAB_00c5c86c;
      }
      pTVar69 = (pTVar69->next).sqe_next;
    } while (pTVar69 != (TCGLabelQemuLdst *)0x0);
    iVar23 = 0;
  }
LAB_00c5c86c:
  if ((!bVar77) && (iVar23 = tcg_out_pool_finalize(s), -1 < iVar23)) {
    for (pTVar75 = (s->labels).sqh_first; pTVar75 != (TCGLabel *)0x0;
        pTVar75 = (pTVar75->next).sqe_next) {
      value = (pTVar75->u).value;
      pTVar76 = (TCGRelocation *)&pTVar75->relocs;
      while (pTVar76 = (pTVar76->next).sqe_next, pTVar76 != (TCGRelocation *)0x0) {
        _Var19 = patch_reloc(pTVar76->ptr,pTVar76->type,value,pTVar76->addend);
        if (!_Var19) goto LAB_00c5c8bc;
      }
    }
LAB_00c5c8bc:
    iVar23 = -2;
    if (pTVar75 == (TCGLabel *)0x0) {
      iVar23 = *(int *)pptVar3 - *(int *)&s->code_buf;
    }
  }
  return iVar23;
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}